

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::read3Channel<unsigned_short,5u,6u,5u,11u,5u,0u>
               (GLuint channel,GLubyte *pixel,GLdouble *out_value)

{
  TestError *this;
  GLdouble d_value;
  GLdouble d_max;
  unsigned_short t_value;
  unsigned_short result;
  unsigned_short *ptr;
  unsigned_short off;
  unsigned_short max;
  unsigned_short mask;
  GLdouble *out_value_local;
  GLubyte *pixel_local;
  GLuint channel_local;
  
  if (channel == 0) {
    ptr._6_2_ = 0x1f;
    ptr._4_2_ = 0x1f;
    ptr._2_1_ = 0xb;
  }
  else if (channel == 1) {
    ptr._6_2_ = 0x3f;
    ptr._4_2_ = 0x3f;
    ptr._2_1_ = 5;
  }
  else {
    if (channel != 2) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid channel",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x773);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    ptr._6_2_ = 0x1f;
    ptr._4_2_ = 0x1f;
    ptr._2_1_ = 0;
  }
  *out_value = (double)(*(ushort *)pixel >> ptr._2_1_ & ptr._6_2_) / (double)ptr._4_2_;
  return;
}

Assistant:

void read3Channel(GLuint channel, const GLubyte* pixel, GLdouble& out_value)
{
	T		 mask	= 0;
	T		 max	 = 0;
	T		 off	 = 0;
	const T* ptr	 = (T*)pixel;
	T		 result  = 0;
	const T  t_value = ptr[0];

	static const T max_1 = (1 << size_1) - 1;
	static const T max_2 = (1 << size_2) - 1;
	static const T max_3 = (1 << size_3) - 1;

	switch (channel)
	{
	case 0:
		mask = max_1;
		max  = max_1;
		off  = off_1;
		break;
	case 1:
		mask = max_2;
		max  = max_2;
		off  = off_2;
		break;
	case 2:
		mask = max_3;
		max  = max_3;
		off  = off_3;
		break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}

	result = (T)((t_value >> off) & mask);

	const GLdouble d_max   = (GLdouble)max;
	const GLdouble d_value = (GLdouble)result;

	out_value = d_value / d_max;
}